

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

int service_connection(curl_socket_t msgsock,httprequest *req,curl_socket_t listensock,
                      char *connecthost)

{
  int rc;
  char *connecthost_local;
  curl_socket_t listensock_local;
  httprequest *req_local;
  curl_socket_t msgsock_local;
  
  req_local._0_4_ = msgsock;
  if (got_exit_signal == 0) {
    do {
      if (req->done_processing != 0) {
        if ((prevbounce & 1U) != 0) {
          if ((req->testno == prevtestno) && (req->partno == prevpartno)) {
            req->partno = req->partno + 1;
            logmsg("BOUNCE part number to %ld",req->partno);
          }
          else {
            prevbounce = false;
            prevtestno = -1;
            prevpartno = -1;
          }
        }
        send_doc((curl_socket_t)req_local,req);
        if (got_exit_signal != 0) {
          return -1;
        }
        if (req->testno < 0) {
          logmsg("special request received, no persistency");
          return -1;
        }
        if ((req->open & 1U) == 0) {
          logmsg("instructed to close connection after server-reply");
          return -1;
        }
        if ((req->connect_request & 1U) != 0) {
          if ((is_proxy & 1U) == 0) {
            logmsg("received CONNECT but isn\'t running as proxy!");
            return 1;
          }
          http_connect((curl_socket_t *)&req_local,listensock,connecthost,req->connect_port);
          return -1;
        }
        if ((req->upgrade_request & 1U) != 0) {
          http2(req);
          return -1;
        }
        if ((req->open & 1U) != 0) {
          logmsg("=> persistent connection request ended, awaits new request\n");
          return 1;
        }
        return -1;
      }
      req_local._4_4_ = get_request((curl_socket_t)req_local,req);
    } while (0 < req_local._4_4_);
  }
  else {
    req_local._4_4_ = -1;
  }
  return req_local._4_4_;
}

Assistant:

static int service_connection(curl_socket_t msgsock, struct httprequest *req,
                              curl_socket_t listensock,
                              const char *connecthost)
{
  if(got_exit_signal)
    return -1;

  while(!req->done_processing) {
    int rc = get_request(msgsock, req);
    if(rc <= 0) {
      /* Nothing further to read now, possibly because the socket was closed */
      return rc;
    }
  }

  if(prevbounce) {
    /* bounce treatment requested */
    if((req->testno == prevtestno) &&
       (req->partno == prevpartno)) {
      req->partno++;
      logmsg("BOUNCE part number to %ld", req->partno);
    }
    else {
      prevbounce = FALSE;
      prevtestno = -1;
      prevpartno = -1;
    }
  }

  send_doc(msgsock, req);
  if(got_exit_signal)
    return -1;

  if(req->testno < 0) {
    logmsg("special request received, no persistency");
    return -1;
  }
  if(!req->open) {
    logmsg("instructed to close connection after server-reply");
    return -1;
  }

  if(req->connect_request) {
    /* a CONNECT request, setup and talk the tunnel */
    if(!is_proxy) {
      logmsg("received CONNECT but isn't running as proxy!");
      return 1;
    }
    else {
      http_connect(&msgsock, listensock, connecthost, req->connect_port);
      return -1;
    }
  }

  if(req->upgrade_request) {
    /* an upgrade request, switch to http2 here */
    http2(req);
    return -1;
  }

  /* if we got a CONNECT, loop and get another request as well! */

  if(req->open) {
    logmsg("=> persistent connection request ended, awaits new request\n");
    return 1;
  }

  return -1;
}